

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int ffcmph(fitsfile *fptr,int *status)

{
  int iVar1;
  void *buffer;
  FITSfile *pFVar2;
  long lVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  size_t __size;
  void *__ptr;
  fitsfile *tptr;
  int typecode;
  LONGLONG repeat;
  LONGLONG offset;
  LONGLONG overlap;
  LONGLONG unused;
  LONGLONG pcount;
  int valid;
  char message [81];
  char comm [73];
  fitsfile *local_160;
  ulong local_158;
  int local_14c;
  long local_148;
  long local_140;
  LONGLONG local_138;
  ulong local_130;
  long local_128;
  size_t local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  int local_ec;
  char local_e8 [96];
  LONGLONG local_88 [11];
  
  if (0 < *status) {
    return *status;
  }
  fftheap(fptr,(LONGLONG *)0x0,&local_100,&local_108,&local_ec,status);
  if (local_ec == 0) {
    *status = 0x108;
    iVar1 = 0x108;
  }
  else {
    if ((((fptr->Fptr->hdutype == 2) && (fptr->Fptr->heapsize != 0)) &&
        (local_108 != 0 || local_100 != 0)) && (*status < 1)) {
      iVar1 = ffinit(&local_160,"mem://tempheapfile",status);
      if (iVar1 == 0) {
        iVar1 = ffcopy(fptr,local_160,0,status);
        if (iVar1 == 0) {
          buffer = malloc(10000);
          if (buffer == (void *)0x0) {
            builtin_strncpy(local_e8 + 0x20,"y the heap",0xb);
            builtin_strncpy(local_e8 + 0x10,"te buffer to cop",0x10);
            builtin_strncpy(local_e8,"Failed to alloca",0x10);
            ffxmsg(5,local_e8);
            ffclos(local_160,status);
            *status = 0x71;
            return 0x71;
          }
          local_128 = local_160->Fptr->heapstart + local_160->Fptr->datastart;
          pFVar2 = fptr->Fptr;
          local_138 = pFVar2->heapsize;
          local_148 = pFVar2->heapstart + pFVar2->datastart;
          pFVar2->heapsize = 0;
          if (0 < pFVar2->tfield) {
            sVar6 = 10000;
            local_158 = 1;
            do {
              if (0 < *status) break;
              ffgtclll(local_160,(int)local_158,&local_14c,local_88,&local_f8,status);
              pFVar2 = fptr->Fptr;
              if ((local_14c < 1) && (0 < pFVar2->numrows)) {
                local_130 = (ulong)(uint)-local_14c / 10;
                lVar3 = 0;
                __ptr = buffer;
                do {
                  local_118 = lVar3 + 1;
                  ffgdesll(local_160,(int)local_158,local_118,&local_140,&local_110,status);
                  if (local_14c == -1) {
                    lVar3 = local_140 + 0xe;
                    if (-1 < local_140 + 7) {
                      lVar3 = local_140 + 7;
                    }
                    __size = lVar3 >> 3;
                  }
                  else {
                    __size = local_140 * local_130;
                  }
                  sVar5 = sVar6;
                  buffer = __ptr;
                  if (((long)sVar6 < (long)__size) &&
                     (buffer = realloc(__ptr,__size), sVar5 = __size, buffer == (void *)0x0)) {
                    *status = 0x71;
                    sVar5 = sVar6;
                    buffer = __ptr;
                  }
                  pFVar2 = fptr->Fptr;
                  local_120 = sVar5;
                  if (pFVar2->lasthdu == 0) {
                    lVar3 = local_148 + __size + pFVar2->heapsize;
                    if (pFVar2->headstart[(long)pFVar2->curhdu + 1] < lVar3) {
                      lVar3 = (lVar3 + ~pFVar2->headstart[(long)pFVar2->curhdu + 1]) / 0xb40 + 1;
                      iVar1 = ffiblk(fptr,lVar3,1,status);
                      if (0 < iVar1) {
                        snprintf(local_e8,0x51,
                                 "Failed to extend the size of the variable length heap by %ld blocks."
                                 ,lVar3);
                        ffxmsg(5,local_e8);
                      }
                    }
                  }
                  ffmbyt(local_160,local_110 + local_128,0,status);
                  ffgbyt(local_160,__size,buffer,status);
                  ffmbyt(fptr,fptr->Fptr->heapsize + local_148,1,status);
                  ffpbyt(fptr,__size,buffer,status);
                  lVar3 = local_118;
                  ffpdes(fptr,(int)local_158,local_118,local_140,fptr->Fptr->heapsize,status);
                  pFVar2 = fptr->Fptr;
                  pFVar2->heapsize = pFVar2->heapsize + __size;
                  if (0 < *status) {
                    free(buffer);
                    goto LAB_001487bb;
                  }
                  sVar6 = local_120;
                  __ptr = buffer;
                } while (lVar3 < pFVar2->numrows);
              }
              iVar1 = (int)local_158;
              local_158 = (ulong)(iVar1 + 1);
            } while (iVar1 < pFVar2->tfield);
          }
          free(buffer);
          ffclos(local_160,status);
          pFVar2 = fptr->Fptr;
          lVar3 = pFVar2->heapsize;
          uVar4 = pFVar2->headstart[(long)pFVar2->curhdu + 1] - (local_148 + lVar3);
          if (0xb3f < (long)uVar4) {
            pFVar2->heapsize = local_138;
            ffdblk(fptr,uVar4 / 0xb40,status);
            fptr->Fptr->heapsize = lVar3;
          }
          ffmaky(fptr,2,status);
          ffgkyjj(fptr,"PCOUNT",&local_f8,(char *)local_88,status);
          lVar3 = fptr->Fptr->heapsize;
          if (lVar3 != local_f8) {
            ffmkyj(fptr,"PCOUNT",lVar3,(char *)local_88,status);
          }
          ffrdef(fptr,status);
        }
        else {
          builtin_strncpy(local_e8,"Failed to create copy of the heap",0x22);
          ffxmsg(5,local_e8);
LAB_001487bb:
          ffclos(local_160,status);
        }
      }
      else {
        builtin_strncpy(local_e8 + 0x20,"for the heap",0xd);
        builtin_strncpy(local_e8 + 0x10," temporary file ",0x10);
        builtin_strncpy(local_e8,"Failed to create",0x10);
        ffxmsg(5,local_e8);
      }
    }
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffcmph(fitsfile *fptr,  /* I -FITS file pointer                         */
           int *status)     /* IO - error status                            */
/*
  compress the binary table heap by reordering the contents heap and
  recovering any unused space
*/
{
    fitsfile *tptr;
    int jj, typecode, pixsize, valid;
    long ii, buffsize = 10000, nblock, nbytes;
    LONGLONG  unused, overlap;
    LONGLONG repeat, offset;
    char *buffer, *tbuff, comm[FLEN_COMMENT];
    char message[FLEN_ERRMSG];
    LONGLONG pcount;
    LONGLONG readheapstart, writeheapstart, endpos, t1heapsize, t2heapsize;

    if (*status > 0)
        return(*status);

    /* get information about the current heap */
    fftheap(fptr, NULL, &unused, &overlap, &valid, status);

    if (!valid)
       return(*status = BAD_HEAP_PTR);  /* bad heap pointers */

    /* return if this is not a binary table HDU or if the heap is OK as is */
    if ( (fptr->Fptr)->hdutype != BINARY_TBL || (fptr->Fptr)->heapsize == 0 ||
         (unused == 0 && overlap == 0) || *status > 0 )
        return(*status);

    /* copy the current HDU to a temporary file in memory */
    if (ffinit( &tptr, "mem://tempheapfile", status) )
    {
        snprintf(message,FLEN_ERRMSG,"Failed to create temporary file for the heap");
        ffpmsg(message);
        return(*status);
    }
    if ( ffcopy(fptr, tptr, 0, status) )
    {
        snprintf(message,FLEN_ERRMSG,"Failed to create copy of the heap");
        ffpmsg(message);
        ffclos(tptr, status);
        return(*status);
    }

    buffer = (char *) malloc(buffsize);  /* allocate initial buffer */
    if (!buffer)
    {
        snprintf(message,FLEN_ERRMSG,"Failed to allocate buffer to copy the heap");
        ffpmsg(message);
        ffclos(tptr, status);
        return(*status = MEMORY_ALLOCATION);
    }
    
    readheapstart  = (tptr->Fptr)->datastart + (tptr->Fptr)->heapstart;
    writeheapstart = (fptr->Fptr)->datastart + (fptr->Fptr)->heapstart;

    t1heapsize = (fptr->Fptr)->heapsize;  /* save original heap size */
    (fptr->Fptr)->heapsize = 0;  /* reset heap to zero */

    /* loop over all cols */
    for (jj = 1; jj <= (fptr->Fptr)->tfield && *status <= 0; jj++)
    {
        ffgtcl(tptr, jj, &typecode, NULL, NULL, status);
        if (typecode > 0)
           continue;        /* ignore fixed length columns */

        pixsize = -typecode / 10;

        /* copy heap data, row by row */
        for (ii = 1; ii <= (fptr->Fptr)->numrows; ii++)
        {
            ffgdesll(tptr, jj, ii, &repeat, &offset, status);
            if (typecode == -TBIT)
                nbytes = (long) (repeat + 7) / 8;
            else
                nbytes = (long) repeat * pixsize;

            /* increase size of buffer if necessary to read whole array */
            if (nbytes > buffsize)
            {
                tbuff = realloc(buffer, nbytes);

                if (tbuff)
                {
                    buffer = tbuff;
                    buffsize = nbytes;
                }
                else
                    *status = MEMORY_ALLOCATION;
            }

            /* If this is not the last HDU in the file, then check if */
            /* extending the heap would overwrite the following header. */
            /* If so, then have to insert more blocks. */
            if ( !((fptr->Fptr)->lasthdu) )
            {
              endpos = writeheapstart + (fptr->Fptr)->heapsize + nbytes;

              if (endpos > (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1])
              {
                /* calc the number of blocks that need to be added */
                nblock = (long) (((endpos - 1 - 
                         (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1] ) 
                         / 2880) + 1);

                if (ffiblk(fptr, nblock, 1, status) > 0) /* insert blocks */
                {
                  snprintf(message,FLEN_ERRMSG,
       "Failed to extend the size of the variable length heap by %ld blocks.",
                   nblock);
                   ffpmsg(message);
                }
              }
            }

            /* read arrray of bytes from temporary copy */
            ffmbyt(tptr, readheapstart + offset, REPORT_EOF, status);
            ffgbyt(tptr, nbytes, buffer, status);

            /* write arrray of bytes back to original file */
            ffmbyt(fptr, writeheapstart + (fptr->Fptr)->heapsize, 
                    IGNORE_EOF, status);
            ffpbyt(fptr, nbytes, buffer, status);

            /* write descriptor */
            ffpdes(fptr, jj, ii, repeat, 
                   (fptr->Fptr)->heapsize, status);

            (fptr->Fptr)->heapsize += nbytes; /* update heapsize */

            if (*status > 0)
            {
               free(buffer);
               ffclos(tptr, status);
               return(*status);
            }
        }
    }

    free(buffer);
    ffclos(tptr, status);

    /* delete any empty blocks at the end of the HDU */
    nblock = (long) (( (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1] -
             (writeheapstart + (fptr->Fptr)->heapsize) ) / 2880);

    if (nblock > 0)
    {
       t2heapsize = (fptr->Fptr)->heapsize;  /* save new heap size */
       (fptr->Fptr)->heapsize = t1heapsize;  /* restore  original heap size */

       ffdblk(fptr, nblock, status);
       (fptr->Fptr)->heapsize = t2heapsize;  /* reset correct heap size */
    }

    /* update the PCOUNT value (size of heap) */
    ffmaky(fptr, 2, status);         /* reset to beginning of header */

    ffgkyjj(fptr, "PCOUNT", &pcount, comm, status);
    if ((fptr->Fptr)->heapsize != pcount)
    {
        ffmkyj(fptr, "PCOUNT", (fptr->Fptr)->heapsize, comm, status);
    }
    ffrdef(fptr, status);  /* rescan new HDU structure */
    return(*status);
}